

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdSArray.h
# Opt level: O3

void __thiscall
HACD::SArray<unsigned_long_long,_16UL>::PushBack
          (SArray<unsigned_long_long,_16UL> *this,unsigned_long_long *value)

{
  SArray<unsigned_long_long,_16UL> *pSVar1;
  unsigned_long_long uVar2;
  SArray<unsigned_long_long,_16UL> *__dest;
  ulong uVar3;
  SArray<unsigned_long_long,_16UL> *__src;
  ulong uVar4;
  
  uVar4 = this->m_size;
  uVar3 = this->m_maxSize;
  if (uVar4 == uVar3) {
    uVar3 = uVar4 * 2;
    __dest = (SArray<unsigned_long_long,_16UL> *)
             operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar4 << 4);
    pSVar1 = (SArray<unsigned_long_long,_16UL> *)this->m_data;
    __src = pSVar1;
    if (uVar4 == 0x10) {
      __src = this;
    }
    memcpy(__dest,__src,uVar4 * 8);
    if (pSVar1 != (SArray<unsigned_long_long,_16UL> *)0x0) {
      operator_delete__(pSVar1);
      uVar4 = this->m_size;
    }
    this->m_data = (unsigned_long_long *)__dest;
    this->m_maxSize = uVar3;
  }
  else {
    __dest = (SArray<unsigned_long_long,_16UL> *)this->m_data;
  }
  uVar2 = *value;
  if (uVar3 == 0x10) {
    __dest = this;
  }
  this->m_size = uVar4 + 1;
  __dest->m_data0[uVar4] = uVar2;
  return;
}

Assistant:

void                    PushBack(const T &  value)
                                    {
                                        if (m_size==m_maxSize)
                                        {
                                            size_t maxSize = (m_maxSize << 1);                                            
                                            T * temp = new T[maxSize];
                                            memcpy(temp, Data(), m_maxSize*sizeof(T));
                                            delete [] m_data;
                                            m_data = temp;
                                            m_maxSize = maxSize;
                                        }
                                        T * const data = Data();
                                        data[m_size++] = value;
                                    }